

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O3

int init(EVP_PKEY_CTX *ctx)

{
  djg_clock *__ptr [1];
  bool bVar1;
  bool bVar2;
  bool bVar3;
  undefined7 extraout_var;
  undefined8 *puVar4;
  
  __ptr[0] = g_gl.clocks[0];
  if (g_gl.clocks[0] != (djg_clock *)0x0) {
    (*glad_glDeleteQueries)(2,g_gl.clocks[0]->queries);
    free(__ptr[0]);
  }
  g_gl.clocks[0] = djgc_create();
  bVar1 = loadTextures();
  if (bVar1) {
    bVar1 = loadBuffers();
    if (bVar1) {
      bVar1 = loadBackFramebuffer();
      bVar2 = loadSceneFramebuffer();
      if ((bVar1) && (bVar2)) {
        bVar1 = loadEmptyVertexArray();
        bVar2 = loadSphereVertexArray();
        if ((bVar1) && (bVar2)) {
          bVar1 = loadViewerProgram();
          bVar2 = loadBackgroundProgram();
          bVar3 = loadSphereProgram();
          if (((bVar1) && (bVar2)) && (bVar3)) {
            return (int)CONCAT71(extraout_var,bVar3);
          }
        }
      }
    }
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = std::__cxx11::string::operator=;
  __cxa_throw(puVar4,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

void init()
{
    bool v = true;
    int i;

    for (i = 0; i < CLOCK_COUNT; ++i) {
        if (g_gl.clocks[i])
            djgc_release(g_gl.clocks[i]);
        g_gl.clocks[i] = djgc_create();
    }

    if (v) v&= loadTextures();
    if (v) v&= loadBuffers();
    if (v) v&= loadFramebuffers();
    if (v) v&= loadVertexArrays();
    if (v) v&= loadPrograms();

    if (!v) throw std::exception();
}